

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::LayerHeader::Encode(LayerHeader *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LayerHeader *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8LayerNumber);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8LayerSpecificInfo);
  KDataStream::operator<<(pKVar1,this->m_ui16LayerLength);
  return;
}

Assistant:

void LayerHeader::Encode( KDataStream & stream ) const
{
    stream << m_ui8LayerNumber
           << m_ui8LayerSpecificInfo
           << m_ui16LayerLength;
}